

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

UnaryBinsSelectExpr * __thiscall
slang::BumpAllocator::emplace<slang::ast::UnaryBinsSelectExpr,slang::ast::BinsSelectExpr_const&>
          (BumpAllocator *this,BinsSelectExpr *args)

{
  UnaryBinsSelectExpr *pUVar1;
  
  pUVar1 = (UnaryBinsSelectExpr *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((UnaryBinsSelectExpr *)this->endPtr < pUVar1 + 1) {
    pUVar1 = (UnaryBinsSelectExpr *)allocateSlow(this,0x20,8);
  }
  else {
    this->head->current = (byte *)(pUVar1 + 1);
  }
  (pUVar1->super_BinsSelectExpr).kind = Unary;
  (pUVar1->super_BinsSelectExpr).syntax = (SyntaxNode *)0x0;
  pUVar1->expr = args;
  pUVar1->op = Negation;
  return pUVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }